

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_renorm(bitstream *str,h264_cabac_context *cabac)

{
  int iVar1;
  bitstream *in_RSI;
  int *in_RDI;
  uint32_t tmp;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  vs_dir in_stack_ffffffffffffffe4;
  
  while( true ) {
    while( true ) {
      if (0xff < *(uint *)&in_RSI[0x25].field_0x4) {
        return 0;
      }
      *(int *)&in_RSI[0x25].field_0x4 = *(int *)&in_RSI[0x25].field_0x4 << 1;
      in_RSI[0x25].dir = in_RSI[0x25].dir << 1;
      if (*in_RDI != 0) break;
      if (in_RSI[0x25].dir < 0x200) {
        iVar1 = put_bit(in_RSI,(h264_cabac_context *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else if (in_RSI[0x25].dir < 0x400) {
        *(int *)((long)&in_RSI[0x25].bytes + 4) = *(int *)((long)&in_RSI[0x25].bytes + 4) + 1;
        in_RSI[0x25].dir = in_RSI[0x25].dir - 0x200;
      }
      else {
        iVar1 = put_bit(in_RSI,(h264_cabac_context *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
        if (iVar1 != 0) {
          return 1;
        }
        in_RSI[0x25].dir = in_RSI[0x25].dir - 0x400;
      }
    }
    iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    if (iVar1 != 0) break;
    in_RSI[0x25].dir = in_stack_ffffffffffffffe4 | in_RSI[0x25].dir;
  }
  return 1;
}

Assistant:

int h264_cabac_renorm(struct bitstream *str, struct h264_cabac_context *cabac) {
	while (cabac->codIRange < 256) {
		cabac->codIRange <<= 1;
		cabac->codIOffset <<= 1;
		if (str->dir == VS_ENCODE) {
			if (cabac->codIOffset < 512) {
				if (put_bit(str, cabac, 0))
					return 1;
			} else if (cabac->codIOffset >= 1024) {
				if (put_bit(str, cabac, 1))
					return 1;
				cabac->codIOffset -= 1024;
			} else {
				cabac->bitsOutstanding++;
				cabac->codIOffset -= 512;
			}
		} else {
			uint32_t tmp;
			if (vs_u(str, &tmp, 1))
				return 1;
			cabac->codIOffset |= tmp;
		}
	}
	return 0;
}